

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

void __thiscall
minja::ForNode::do_render(ForNode *this,ostringstream *out,shared_ptr<minja::Context> *context)

{
  Expression *this_00;
  runtime_error *this_01;
  CallableType loop_function;
  function<void_(minja::Value_&)> visit;
  anon_class_40_5_e1151638 local_98;
  Value iterable_value;
  
  this_00 = (this->iterable).super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr;
  if (this_00 == (Expression *)0x0) {
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"ForNode.iterable is null");
  }
  else {
    if ((this->body).super___shared_ptr<minja::TemplateNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      Expression::evaluate(&iterable_value,this_00,context);
      loop_function.super__Function_base._M_manager = (_Manager_type)0x0;
      loop_function._M_invoker = (_Invoker_type)0x0;
      loop_function.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
      loop_function.super__Function_base._M_functor._8_8_ = 0;
      local_98.iterable_value = &iterable_value;
      local_98.this = this;
      local_98.context = context;
      local_98.out = out;
      local_98.loop_function = &loop_function;
      std::function<void(minja::Value&)>::
      function<minja::ForNode::do_render(std::__cxx11::ostringstream&,std::shared_ptr<minja::Context>const&)const::_lambda(minja::Value&)_1_,void>
                ((function<void(minja::Value&)> *)&visit,&local_98);
      if (this->recursive == true) {
        local_98.iterable_value = (Value *)&visit;
        std::function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>::
        operator=((function<minja::Value(std::shared_ptr<minja::Context>const&,minja::ArgumentsValue&)>
                   *)&loop_function,(anon_class_8_1_a8ca3c6b *)&local_98);
      }
      std::function<void_(minja::Value_&)>::operator()(&visit,&iterable_value);
      std::_Function_base::~_Function_base(&visit.super__Function_base);
      std::_Function_base::~_Function_base(&loop_function.super__Function_base);
      Value::~Value(&iterable_value);
      return;
    }
    this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_01,"ForNode.body is null");
  }
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void do_render(std::ostringstream & out, const std::shared_ptr<Context> & context) const override {
      // https://jinja.palletsprojects.com/en/3.0.x/templates/#for
      if (!iterable) throw std::runtime_error("ForNode.iterable is null");
      if (!body) throw std::runtime_error("ForNode.body is null");

      auto iterable_value = iterable->evaluate(context);
      Value::CallableType loop_function;

      std::function<void(Value&)> visit = [&](Value& iter) {
          auto filtered_items = Value::array();
          if (!iter.is_null()) {
            if (!iterable_value.is_iterable()) {
              throw std::runtime_error("For loop iterable must be iterable: " + iterable_value.dump());
            }
            iterable_value.for_each([&](Value & item) {
                destructuring_assign(var_names, context, item);
                if (!condition || condition->evaluate(context).to_bool()) {
                  filtered_items.push_back(item);
                }
            });
          }
          if (filtered_items.empty()) {
            if (else_body) {
              else_body->render(out, context);
            }
          } else {
              auto loop = recursive ? Value::callable(loop_function) : Value::object();
              loop.set("length", (int64_t) filtered_items.size());

              size_t cycle_index = 0;
              loop.set("cycle", Value::callable([&](const std::shared_ptr<Context> &, ArgumentsValue & args) {
                  if (args.args.empty() || !args.kwargs.empty()) {
                      throw std::runtime_error("cycle() expects at least 1 positional argument and no named arg");
                  }
                  auto item = args.args[cycle_index];
                  cycle_index = (cycle_index + 1) % args.args.size();
                  return item;
              }));
              auto loop_context = Context::make(Value::object(), context);
              loop_context->set("loop", loop);
              for (size_t i = 0, n = filtered_items.size(); i < n; ++i) {
                  auto & item = filtered_items.at(i);
                  destructuring_assign(var_names, loop_context, item);
                  loop.set("index", (int64_t) i + 1);
                  loop.set("index0", (int64_t) i);
                  loop.set("revindex", (int64_t) (n - i));
                  loop.set("revindex0", (int64_t) (n - i - 1));
                  loop.set("length", (int64_t) n);
                  loop.set("first", i == 0);
                  loop.set("last", i == (n - 1));
                  loop.set("previtem", i > 0 ? filtered_items.at(i - 1) : Value());
                  loop.set("nextitem", i < n - 1 ? filtered_items.at(i + 1) : Value());
                  try {
                      body->render(out, loop_context);
                  } catch (const LoopControlException & e) {
                      if (e.control_type == LoopControlType::Break) break;
                      if (e.control_type == LoopControlType::Continue) continue;
                  }
              }
          }
      };

      if (recursive) {
        loop_function = [&](const std::shared_ptr<Context> &, ArgumentsValue & args) {
            if (args.args.size() != 1 || !args.kwargs.empty() || !args.args[0].is_array()) {
                throw std::runtime_error("loop() expects exactly 1 positional iterable argument");
            }
            auto & items = args.args[0];
            visit(items);
            return Value();
        };
      }

      visit(iterable_value);
  }